

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::scoped_padder::scoped_padder
          (scoped_padder *this,size_t wrapped_size,padding_info *padinfo,memory_buf_t *dest)

{
  ulong uVar1;
  long count;
  scoped_padder *in_RCX;
  long *in_RDX;
  long in_RSI;
  long *in_RDI;
  long reminder;
  long half_pad;
  long in_stack_ffffffffffffffd8;
  
  *in_RDI = (long)in_RDX;
  in_RDI[1] = (long)in_RCX;
  fmt::v11::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)(in_RDI + 3),
             "                                                                ",0x40);
  in_RDI[2] = *in_RDX - in_RSI;
  if (0 < in_RDI[2]) {
    if (*(int *)(*in_RDI + 8) == 0) {
      pad_it(in_RCX,in_stack_ffffffffffffffd8);
      in_RDI[2] = 0;
    }
    else if (*(int *)(*in_RDI + 8) == 2) {
      count = in_RDI[2] / 2;
      uVar1 = in_RDI[2];
      pad_it(in_RCX,count);
      in_RDI[2] = count + (uVar1 & 1);
    }
  }
  return;
}

Assistant:

scoped_padder(size_t wrapped_size, const padding_info &padinfo, memory_buf_t &dest)
        : padinfo_(padinfo),
          dest_(dest) {
        remaining_pad_ = static_cast<long>(padinfo.width_) - static_cast<long>(wrapped_size);
        if (remaining_pad_ <= 0) {
            return;
        }

        if (padinfo_.side_ == padding_info::pad_side::left) {
            pad_it(remaining_pad_);
            remaining_pad_ = 0;
        } else if (padinfo_.side_ == padding_info::pad_side::center) {
            auto half_pad = remaining_pad_ / 2;
            auto reminder = remaining_pad_ & 1;
            pad_it(half_pad);
            remaining_pad_ = half_pad + reminder;  // for the right side
        }
    }